

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrRenderer.cpp
# Opt level: O0

void __thiscall
rr::RenderTarget::RenderTarget
          (RenderTarget *this,MultisamplePixelBufferAccess *colorMultisampleBuffer,
          MultisamplePixelBufferAccess *depthMultisampleBuffer,
          MultisamplePixelBufferAccess *stencilMultisampleBuffer)

{
  PixelBufferAccess *pPVar1;
  RenderTarget *local_80;
  PixelBufferAccess local_78;
  PixelBufferAccess local_50;
  MultisamplePixelBufferAccess *local_28;
  MultisamplePixelBufferAccess *stencilMultisampleBuffer_local;
  MultisamplePixelBufferAccess *depthMultisampleBuffer_local;
  MultisamplePixelBufferAccess *colorMultisampleBuffer_local;
  RenderTarget *this_local;
  
  local_80 = this;
  local_28 = stencilMultisampleBuffer;
  stencilMultisampleBuffer_local = depthMultisampleBuffer;
  depthMultisampleBuffer_local = colorMultisampleBuffer;
  colorMultisampleBuffer_local = (MultisamplePixelBufferAccess *)this;
  do {
    MultisamplePixelBufferAccess::MultisamplePixelBufferAccess
              ((MultisamplePixelBufferAccess *)local_80);
    local_80 = (RenderTarget *)&local_80->field_0x28;
  } while (local_80 != (RenderTarget *)&this->m_numColorBuffers);
  this->m_numColorBuffers = 1;
  pPVar1 = MultisamplePixelBufferAccess::raw(stencilMultisampleBuffer_local);
  tcu::getEffectiveDepthStencilAccess(&local_50,pPVar1,MODE_DEPTH);
  MultisamplePixelBufferAccess::fromMultisampleAccess(&this->m_depthBuffer,&local_50);
  pPVar1 = MultisamplePixelBufferAccess::raw(local_28);
  tcu::getEffectiveDepthStencilAccess(&local_78,pPVar1,MODE_STENCIL);
  MultisamplePixelBufferAccess::fromMultisampleAccess(&this->m_stencilBuffer,&local_78);
  memcpy(this,depthMultisampleBuffer_local,0x28);
  return;
}

Assistant:

RenderTarget::RenderTarget (const MultisamplePixelBufferAccess& colorMultisampleBuffer,
							const MultisamplePixelBufferAccess& depthMultisampleBuffer,
							const MultisamplePixelBufferAccess& stencilMultisampleBuffer)
	: m_numColorBuffers	(1)
	, m_depthBuffer		(MultisamplePixelBufferAccess::fromMultisampleAccess(tcu::getEffectiveDepthStencilAccess(depthMultisampleBuffer.raw(), tcu::Sampler::MODE_DEPTH)))
	, m_stencilBuffer	(MultisamplePixelBufferAccess::fromMultisampleAccess(tcu::getEffectiveDepthStencilAccess(stencilMultisampleBuffer.raw(), tcu::Sampler::MODE_STENCIL)))
{
	m_colorBuffers[0] = colorMultisampleBuffer;
}